

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O2

void __thiscall
BuildTokenTestCompleteOneStep::~BuildTokenTestCompleteOneStep(BuildTokenTestCompleteOneStep *this)

{
  BuildTokenTest::~BuildTokenTest(&this->super_BuildTokenTest);
  operator_delete(this,0x510);
  return;
}

Assistant:

TEST_F(BuildTokenTest, CompleteOneStep) {
  // plan should execute one command
  string err;
  EXPECT_TRUE(builder_.AddTarget("cat1", &err));
  ASSERT_EQ("", err);

  // allow running of one command
  ExpectCanRunMore(1,   true);
  ExpectAcquireToken(1, true);
  // block and wait for command to finalize
  ExpectWaitForCommand(1, false);

  EXPECT_TRUE(builder_.Build(&err));
  EXPECT_EQ("", err);

  EXPECT_EQ(1u, token_command_runner_.commands_ran_.size());
  EXPECT_TRUE(token_command_runner_.commands_ran_[0] == "cat in1 > cat1");
}